

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall DMovePoly::Tick(DMovePoly *this)

{
  bool bVar1;
  long lVar2;
  FPolyObj *this_00;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  TAngle<double> local_28;
  double dStack_20;
  
  lVar2 = (long)po_NumPolyobjs;
  if (0 < lVar2) {
    this_00 = polyobjs;
    do {
      if (this_00->tag == (this->super_DPolyAction).m_PolyObj) {
        bVar1 = FPolyObj::MovePolyobj(this_00,&this->m_Speedv,false);
        if (!bVar1) {
          return;
        }
        dVar4 = (this->super_DPolyAction).m_Speed;
        dVar6 = ABS(dVar4);
        dVar5 = (this->super_DPolyAction).m_Dist - dVar6;
        (this->super_DPolyAction).m_Dist = dVar5;
        if (dVar5 <= 0.0) {
          SN_StopSequence(this_00);
          (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])(this);
        }
        else if (dVar5 < dVar6) {
          uVar3 = -(ulong)(dVar4 < 0.0);
          dVar4 = (double)(~uVar3 & (ulong)dVar5 | (ulong)-dVar5 & uVar3);
          (this->super_DPolyAction).m_Speed = dVar4;
          TAngle<double>::ToVector(&local_28,dVar4);
          (this->m_Speedv).X = local_28.Degrees;
          (this->m_Speedv).Y = dStack_20;
        }
        FPolyObj::UpdateLinks(this_00);
        return;
      }
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void DMovePoly::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly != NULL)
	{
		if (poly->MovePolyobj (m_Speedv))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				Destroy ();
			}
			else if (m_Dist < absSpeed)
			{
				m_Speed = m_Dist * (m_Speed < 0 ? -1 : 1);
				m_Speedv = m_Angle.ToVector(m_Speed);
			}
			poly->UpdateLinks();
		}
	}
}